

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maropuparser.h
# Opt level: O1

bool __thiscall
FastPForLib::MaropuGapReader::
loadIntegers<std::vector<unsigned_int,FastPForLib::AlignedSTLAllocator<unsigned_int,64ul>>>
          (MaropuGapReader *this,
          vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_> *buffer)

{
  pointer __ptr;
  size_t sVar1;
  int *piVar2;
  char *pcVar3;
  ostream *poVar4;
  runtime_error *this_00;
  bool bVar5;
  uint32_t number;
  uint local_1c;
  
  if ((FILE *)this->fd == (FILE *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"You forgot to open the file.",0x1c);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x28);
    std::ostream::put(-0x28);
    std::ostream::flush();
    bVar5 = false;
  }
  else {
    sVar1 = fread(&local_1c,4,1,(FILE *)this->fd);
    bVar5 = sVar1 == 1;
    if (bVar5) {
      std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>::resize
                (buffer,(ulong)local_1c);
      __ptr = (buffer->
              super__Vector_base<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>
              )._M_impl.super__Vector_impl_data._M_start;
      sVar1 = fread(__ptr,4,(long)(buffer->
                                  super__Vector_base<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>
                                  )._M_impl.super__Vector_impl_data._M_finish - (long)__ptr >> 2,
                    (FILE *)this->fd);
      if (sVar1 != (long)(buffer->
                         super__Vector_base<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>
                         )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(buffer->
                         super__Vector_base<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>
                         )._M_impl.super__Vector_impl_data._M_start >> 2) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"IO status: ",0xb);
        piVar2 = __errno_location();
        pcVar3 = strerror(*piVar2);
        poVar4 = std::operator<<((ostream *)&std::cerr,pcVar3);
        std::endl<char,std::char_traits<char>>(poVar4);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Error reading from file ",0x18);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"bad read");
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
  }
  return bVar5;
}

Assistant:

bool loadIntegers(container &buffer) {
    if (fd == NULL) {
      std::cerr << "You forgot to open the file." << std::endl;
      return false;
    }
    uint32_t number;
    size_t result = fread(&number, sizeof(number), 1, fd);
    if (result != 1) {
      return false;
    }
    buffer.resize(number);
    result = fread(&(buffer[0]), sizeof(uint32_t), buffer.size(), fd);
    if (result != buffer.size()) {
      std::cerr << "IO status: " << strerror(errno) << std::endl;
      std::cerr << "Error reading from file " << std::endl;
      throw std::runtime_error("bad read");
    }
    return true;
  }